

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

bool google::protobuf::internal::anon_unknown_0::ParsingEndsInBuffer(char *ptr,char *end,int depth)

{
  uint32_t uVar1;
  uint32_t tag;
  uint64_t val;
  char *local_48;
  uint local_3c;
  unsigned_long local_38;
  
  local_48 = ptr;
  do {
    if (end <= local_48) {
      return false;
    }
    local_48 = ReadTag(local_48,&local_3c,0);
    if (local_48 == (char *)0x0) {
      return false;
    }
    if (end < local_48) {
      return false;
    }
    if (local_3c == 0) {
      return true;
    }
    switch(local_3c & 7) {
    case 0:
      local_48 = VarintParse<unsigned_long>(local_48,&local_38);
      if (local_48 == (char *)0x0) {
LAB_00214ee3:
        return false;
      }
      break;
    case 1:
      local_48 = local_48 + 8;
      break;
    case 2:
      uVar1 = ReadSize(&local_48);
      if (local_48 == (char *)0x0) {
        return false;
      }
      if ((long)end - (long)local_48 < (long)(int)uVar1) {
        return false;
      }
      local_48 = local_48 + (int)uVar1;
      break;
    case 3:
      depth = depth + 1;
      break;
    case 4:
      if (depth < 1) {
        return true;
      }
      depth = depth + -1;
      break;
    case 5:
      local_48 = local_48 + 4;
      break;
    default:
      goto LAB_00214ee3;
    }
  } while( true );
}

Assistant:

bool ParsingEndsInBuffer(const char* ptr, const char* end, int depth) {
  while (ptr < end) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ptr == nullptr || ptr > end) return false;
    // ending on 0 tag is allowed and is the major reason for the necessity of
    // this function.
    if (tag == 0) return true;
    switch (tag & 7) {
      case 0: {  // Varint
        uint64_t val;
        ptr = VarintParse(ptr, &val);
        if (ptr == nullptr) return false;
        break;
      }
      case 1: {  // fixed64
        ptr += 8;
        break;
      }
      case 2: {  // len delim
        int32_t size = ReadSize(&ptr);
        if (ptr == nullptr || size > end - ptr) return false;
        ptr += size;
        break;
      }
      case 3: {  // start group
        depth++;
        break;
      }
      case 4: {                    // end group
        if (--depth < 0) return true;  // We exit early
        break;
      }
      case 5: {  // fixed32
        ptr += 4;
        break;
      }
      default:
        return false;  // Unknown wireformat
    }
  }
  return false;
}